

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O1

void ut::
     are_equal<agge::tests::mocks::coords_pair<int>,2ul,std::vector<agge::tests::mocks::coords_pair<int>,std::allocator<agge::tests::mocks::coords_pair<int>>>>
               (coords_pair<int> (*expected) [2],
               vector<agge::tests::mocks::coords_pair<int>,_std::allocator<agge::tests::mocks::coords_pair<int>_>_>
               *actual,LocationInfo *location)

{
  int *piVar1;
  int *piVar2;
  pointer pcVar3;
  FailedAssertion *pFVar4;
  long lVar5;
  bool bVar6;
  string local_40;
  
  pcVar3 = (actual->
           super__Vector_base<agge::tests::mocks::coords_pair<int>,_std::allocator<agge::tests::mocks::coords_pair<int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(actual->
            super__Vector_base<agge::tests::mocks::coords_pair<int>,_std::allocator<agge::tests::mocks::coords_pair<int>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar3 != 0x20) {
    pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Values are not equal!","");
    FailedAssertion::FailedAssertion(pFVar4,&local_40,location);
    __cxa_throw(pFVar4,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
  }
  if (((*expected)[0].x1 == pcVar3->x1) && ((*expected)[0].y1 == pcVar3->y1)) {
    bVar6 = false;
    lVar5 = 8;
    do {
      if ((((*(int *)((long)&(*expected)[0].x1 + lVar5) != *(int *)((long)&pcVar3->x1 + lVar5)) ||
           (*(int *)((long)&(*expected)[0].y1 + lVar5) != *(int *)((long)&pcVar3->y1 + lVar5))) ||
          (bVar6 = lVar5 == 0x18, bVar6)) ||
         (*(int *)((long)&(*expected)[0].x2 + lVar5) != *(int *)((long)&pcVar3->x2 + lVar5))) break;
      piVar1 = (int *)((long)&(*expected)[0].y2 + lVar5);
      piVar2 = (int *)((long)&pcVar3->y2 + lVar5);
      lVar5 = lVar5 + 0x10;
    } while (*piVar1 == *piVar2);
    if (bVar6) {
      return;
    }
  }
  pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Value is not \'true\'!","");
  FailedAssertion::FailedAssertion(pFVar4,&local_40,location);
  __cxa_throw(pFVar4,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
}

Assistant:

inline void are_equal(T (&expected)[n], const ContainerT &actual, const LocationInfo &location)
	{
		are_equal(n, static_cast<size_t>(std::distance(actual.begin(), actual.end())), location);
		is_true(std::equal(expected, expected + n, actual.begin()), location);
	}